

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAbase.h
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAbase::~ChNodeFEAbase(ChNodeFEAbase *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

class ChApi ChNodeFEAbase : public virtual ChNodeBase {
  public:
    ChNodeFEAbase() {}

    /// Set the rest position as the actual position.
    virtual void Relax() = 0;

    /// Reset to no speed and acceleration.
    virtual void SetNoSpeedNoAcceleration() = 0;

    /// Set the 'fixed' state of the node.
    /// If true, its current field value is not changed by solver.
    virtual void SetFixed(bool mev) = 0;

    /// Get the 'fixed' state of the node.
    /// If true, its current field value is not changed by solver.
    virtual bool GetFixed() = 0;

    /// Sets the global index of the node
    virtual void SetIndex(unsigned int mindex) { g_index = mindex; }

    /// Gets the global index of the node
    virtual unsigned int GetIndex() { return g_index; }

    double m_TotalMass;  ///< Nodal mass obtained from element masss matrix

  protected:
    //
    // DATA
    //

    unsigned int g_index;  ///< global node index
}